

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O1

ANNdist annDist(int dim,ANNpoint p,ANNpoint q)

{
  ulong uVar1;
  double dVar2;
  
  if (0 < dim) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (p[uVar1] - q[uVar1]) * (p[uVar1] - q[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)dim != uVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

ANNdist annDist(  // interpoint squared distance
    int dim, ANNpoint p, ANNpoint q) {
    register int d;
    register ANNcoord diff;
    register ANNcoord dist;

    dist = 0;
    for (d = 0; d < dim; d++) {
        diff = p[d] - q[d];
        dist = ANN_SUM(dist, ANN_POW(diff));
    }
    return dist;
}